

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String * __thiscall Bstrlib::String::operator+=(String *this,float c)

{
  String local_20;
  
  Print((char *)&local_20,(double)c,"%lg");
  operator+=(this,&local_20);
  if (local_20.super_tagbstring.data != (uchar *)0x0) {
    free(local_20.super_tagbstring.data);
  }
  return this;
}

Assistant:

const String& String::operator +=(const float c)
    {
#ifndef HasFloatParsing
        char buffer[15] = { 0 };
        ftoa(c, buffer, 6);
        return *this += buffer;
#else
        return *this += String::Print("%lg", c);
#endif
    }